

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

void __thiscall QByteArray::resize(QByteArray *this,qsizetype size)

{
  Data *pDVar1;
  long alloc;
  
  alloc = 0;
  if (0 < size) {
    alloc = size;
  }
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar1->super_QArrayData).alloc) - (long)(this->d).ptr) < alloc)) {
    reallocData(this,alloc,Grow);
    pDVar1 = (this->d).d;
    (this->d).size = alloc;
    if (pDVar1 == (Data *)0x0) {
      return;
    }
  }
  else {
    (this->d).size = alloc;
  }
  if ((pDVar1->super_QArrayData).alloc != 0) {
    (this->d).ptr[alloc] = '\0';
  }
  return;
}

Assistant:

void QByteArray::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    const auto capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (d->needsDetach() || size > capacityAtEnd)
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = 0;
}